

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

unsigned_long * __thiscall GF2::Func<4UL,_unsigned_long>::Max(Func<4UL,_unsigned_long> *this)

{
  word x;
  word xmax;
  Func<4UL,_unsigned_long> *this_local;
  
  xmax = 0;
  for (x = 1; x < 0x10; x = x + 1) {
    if (this->_vals[xmax] < this->_vals[x]) {
      xmax = x;
    }
  }
  return this->_vals + xmax;
}

Assistant:

const _T& Max() const
	{	
		word xmax = 0;
		for (word x = 1; x < _size; ++x)
			if (_vals[x] > _vals[xmax]) 
				xmax = x;
		return _vals[xmax];
	}